

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

Gia_Man_t * Of_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int *piVar1;
  Vec_Flt_t *pVVar2;
  Of_Obj_t *pOVar3;
  Gia_Man_t *pGVar4;
  Of_Man_t *p;
  Gia_Man_t *pGVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  
  if (pGia->pSibls != (int *)0x0) {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  pGVar4 = pGia;
  if (pPars->fCoarsen != 0) {
    pGVar4 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p = Of_StoCreate(pGVar4,pPars);
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar4);
    putchar(10);
  }
  Of_ManPrintInit(p);
  Of_ManComputeCuts(p);
  Of_ManPrintQuit(p);
  pGVar5 = p->pGia;
  lVar7 = (long)pGVar5->vCis->nSize;
  if (0 < lVar7) {
    piVar1 = pGVar5->vCis->pArray;
    lVar8 = 0;
    do {
      iVar11 = piVar1[lVar8];
      lVar10 = (long)iVar11;
      if ((lVar10 < 0) || (pGVar5->nObjs <= iVar11)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar11 == 0) break;
      pVVar2 = pGVar5->vInArrs;
      if (pVVar2 == (Vec_Flt_t *)0x0) {
        iVar11 = 0;
      }
      else {
        if (pVVar2->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        fVar12 = 0.0;
        if (0.0 <= pVVar2->pArray[lVar8]) {
          fVar12 = pVVar2->pArray[lVar8];
        }
        iVar11 = (int)(fVar12 * 10.0);
      }
      pOVar3 = p->pObjs;
      pOVar3[lVar10].Delay1 = iVar11;
      pOVar3[lVar10].Delay2 = iVar11;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (p->pPars->nFastEdges == 0) {
    p->Iter = 0;
    if (0 < p->pPars->nRounds) {
      iVar11 = 0;
      do {
        Of_ManComputeForward1(p);
        Of_ManComputeBackward1(p);
        pcVar9 = "Flow ";
        if (iVar11 == 0) {
          pcVar9 = "Delay";
        }
        Of_ManPrintStats(p,pcVar9);
        iVar11 = p->Iter + 1;
        p->Iter = iVar11;
      } while (iVar11 < p->pPars->nRounds);
    }
    iVar11 = p->Iter;
    iVar6 = p->pPars->nRoundsEla + p->pPars->nRounds;
    if (iVar11 < iVar6) {
      do {
        if (iVar11 < iVar6 + -1) {
          Of_ManComputeForward2(p);
        }
        else {
          Of_ManComputeForward1(p);
        }
        Of_ManComputeBackward3(p);
        Of_ManPrintStats(p,"Area ");
        iVar11 = p->Iter + 1;
        p->Iter = iVar11;
        iVar6 = p->pPars->nRoundsEla + p->pPars->nRounds;
      } while (iVar11 < iVar6);
    }
  }
  else {
    p->pPars->nRounds = 1;
    p->Iter = 0;
    if (0 < p->pPars->nRounds) {
      iVar11 = 0;
      do {
        Of_ManComputeForwardDircon1(p);
        Of_ManComputeBackwardDircon1(p);
        pcVar9 = "Flow ";
        if (iVar11 == 0) {
          pcVar9 = "Delay";
        }
        Of_ManPrintStats(p,pcVar9);
        iVar11 = p->Iter + 1;
        p->Iter = iVar11;
      } while (iVar11 < p->pPars->nRounds);
    }
  }
  pGVar5 = Of_ManDeriveMapping(p);
  Gia_ManMappingVerify(pGVar5);
  if (pGVar5->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManConvertPackingToEdges(pGVar5);
  }
  Of_StoDelete(p);
  if (pGVar4 != pGia) {
    Gia_ManStop(pGVar4);
  }
  if (pGVar5 == (Gia_Man_t *)0x0) {
    pGVar4 = Gia_ManDup(pGia);
    return pGVar4;
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Of_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Of_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0, pPars->fCutMin = 1; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Of_StoCreate( pCls, pPars );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Of_ManPrintInit( p );
    Of_ManComputeCuts( p );
    Of_ManPrintQuit( p );

    Gia_ManForEachCiId( p->pGia, Id, i )
    {
        int Time = Of_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0);
        Of_ObjSetDelay1( p, Id, Time );
        Of_ObjSetDelay2( p, Id, Time );
    }

    if ( p->pPars->nFastEdges )
    {
        p->pPars->nRounds = 1;
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForwardDircon1( p );
                Of_ManComputeBackwardDircon1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
    }
    else
    {
        for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
        {
            if ( p->Iter == 0 )
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Delay" );
            }
            else 
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward1( p );
                Of_ManPrintStats( p, "Flow " );
            }
        }
        for ( ; p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla; p->Iter++ )
        {
            if ( p->Iter < p->pPars->nRounds + p->pPars->nRoundsEla - 1 )
            {
                Of_ManComputeForward2( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
            else
            {
                Of_ManComputeForward1( p );
                Of_ManComputeBackward3( p );
                Of_ManPrintStats( p, "Area " );
            }
        }
    }

    pNew = Of_ManDeriveMapping( p );
    Gia_ManMappingVerify( pNew );
    if ( pNew->vPacking )
        Gia_ManConvertPackingToEdges( pNew );
    //Of_ManPrintCuts( p );
    Of_StoDelete( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    if ( pNew == NULL )
        return Gia_ManDup( pGia );
    return pNew;
}